

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O2

void xmlValidateAttributeCallback(void *payload,void *data,xmlChar *name)

{
  long lVar1;
  xmlDtdPtr dtd;
  int iVar2;
  xmlElementPtr pxVar3;
  xmlAttributeType type;
  xmlEnumerationPtr tree;
  undefined8 *puVar4;
  
  if (payload != (void *)0x0) {
    type = *(xmlAttributeType *)((long)payload + 0x50);
    if ((type < (XML_ATTRIBUTE_NOTATION|XML_ATTRIBUTE_CDATA)) &&
       ((0x460U >> (type & 0x1f) & 1) != 0)) {
      if ((*(xmlChar **)((long)payload + 0x58) != (xmlChar *)0x0) &&
         ((iVar2 = xmlValidateAttributeValue2
                             ((xmlValidCtxtPtr)data,*(xmlDocPtr *)((long)data + 0x38),
                              *(xmlChar **)((long)payload + 0x10),type,
                              *(xmlChar **)((long)payload + 0x58)), iVar2 == 0 &&
          (*(int *)((long)data + 0x40) == 1)))) {
        *(undefined4 *)((long)data + 0x40) = 0;
      }
      puVar4 = *(undefined8 **)((long)payload + 0x60);
      if (puVar4 != (undefined8 *)0x0) {
        for (; puVar4 != (undefined8 *)0x0; puVar4 = (undefined8 *)*puVar4) {
          iVar2 = xmlValidateAttributeValue2
                            ((xmlValidCtxtPtr)data,*(xmlDocPtr *)((long)data + 0x38),
                             *(xmlChar **)((long)payload + 0x10),
                             *(xmlAttributeType *)((long)payload + 0x50),(xmlChar *)puVar4[1]);
          if ((iVar2 == 0) && (*(int *)((long)data + 0x40) == 1)) {
            *(undefined4 *)((long)data + 0x40) = 0;
          }
        }
      }
      type = *(xmlAttributeType *)((long)payload + 0x50);
    }
    if (type == XML_ATTRIBUTE_NOTATION) {
      if (*(xmlChar **)((long)payload + 0x70) == (xmlChar *)0x0) {
        xmlErrValid((xmlValidCtxtPtr)data,XML_ERR_INTERNAL_ERROR,
                    "xmlValidateAttributeCallback(%s): internal error\n",
                    *(char **)((long)payload + 0x10));
        return;
      }
      lVar1 = *(long *)((long)payload + 0x40);
      if (((lVar1 == 0) ||
          ((pxVar3 = xmlGetDtdElementDesc
                               (*(xmlDtdPtr *)(lVar1 + 0x50),*(xmlChar **)((long)payload + 0x70)),
           pxVar3 == (xmlElementPtr)0x0 &&
           (pxVar3 = xmlGetDtdElementDesc
                               (*(xmlDtdPtr *)(lVar1 + 0x58),*(xmlChar **)((long)payload + 0x70)),
           pxVar3 == (xmlElementPtr)0x0)))) &&
         ((dtd = *(xmlDtdPtr *)((long)payload + 0x28), dtd == (xmlDtdPtr)0x0 ||
          ((dtd->type != XML_DTD_NODE ||
           (pxVar3 = xmlGetDtdElementDesc(dtd,*(xmlChar **)((long)payload + 0x70)),
           pxVar3 == (xmlElementPtr)0x0)))))) {
        xmlErrValidNode((xmlValidCtxtPtr)data,(xmlNodePtr)0x0,XML_DTD_UNKNOWN_ELEM,
                        "attribute %s: could not find decl for element %s\n",
                        *(xmlChar **)((long)payload + 0x10),*(xmlChar **)((long)payload + 0x70),
                        (xmlChar *)0x0);
      }
      else if (pxVar3->etype == XML_ELEMENT_TYPE_EMPTY) {
        xmlErrValidNode((xmlValidCtxtPtr)data,(xmlNodePtr)0x0,XML_DTD_EMPTY_NOTATION,
                        "NOTATION attribute %s declared for EMPTY element %s\n",
                        *(xmlChar **)((long)payload + 0x10),*(xmlChar **)((long)payload + 0x70),
                        (xmlChar *)0x0);
        *(undefined4 *)((long)data + 0x40) = 0;
      }
    }
  }
  return;
}

Assistant:

static void
xmlValidateAttributeCallback(void *payload, void *data,
	                     const xmlChar *name ATTRIBUTE_UNUSED) {
    xmlAttributePtr cur = (xmlAttributePtr) payload;
    xmlValidCtxtPtr ctxt = (xmlValidCtxtPtr) data;
    int ret;
    xmlDocPtr doc;
    xmlElementPtr elem = NULL;

    if (cur == NULL)
	return;
    switch (cur->atype) {
	case XML_ATTRIBUTE_CDATA:
	case XML_ATTRIBUTE_ID:
	case XML_ATTRIBUTE_IDREF	:
	case XML_ATTRIBUTE_IDREFS:
	case XML_ATTRIBUTE_NMTOKEN:
	case XML_ATTRIBUTE_NMTOKENS:
	case XML_ATTRIBUTE_ENUMERATION:
	    break;
	case XML_ATTRIBUTE_ENTITY:
	case XML_ATTRIBUTE_ENTITIES:
	case XML_ATTRIBUTE_NOTATION:
	    if (cur->defaultValue != NULL) {

		ret = xmlValidateAttributeValue2(ctxt, ctxt->doc, cur->name,
			                         cur->atype, cur->defaultValue);
		if ((ret == 0) && (ctxt->valid == 1))
		    ctxt->valid = 0;
	    }
	    if (cur->tree != NULL) {
		xmlEnumerationPtr tree = cur->tree;
		while (tree != NULL) {
		    ret = xmlValidateAttributeValue2(ctxt, ctxt->doc,
				    cur->name, cur->atype, tree->name);
		    if ((ret == 0) && (ctxt->valid == 1))
			ctxt->valid = 0;
		    tree = tree->next;
		}
	    }
    }
    if (cur->atype == XML_ATTRIBUTE_NOTATION) {
	doc = cur->doc;
	if (cur->elem == NULL) {
	    xmlErrValid(ctxt, XML_ERR_INTERNAL_ERROR,
		   "xmlValidateAttributeCallback(%s): internal error\n",
		   (const char *) cur->name);
	    return;
	}

	if (doc != NULL)
	    elem = xmlGetDtdElementDesc(doc->intSubset, cur->elem);
	if ((elem == NULL) && (doc != NULL))
	    elem = xmlGetDtdElementDesc(doc->extSubset, cur->elem);
	if ((elem == NULL) && (cur->parent != NULL) &&
	    (cur->parent->type == XML_DTD_NODE))
	    elem = xmlGetDtdElementDesc((xmlDtdPtr) cur->parent, cur->elem);
	if (elem == NULL) {
	    xmlErrValidNode(ctxt, NULL, XML_DTD_UNKNOWN_ELEM,
		   "attribute %s: could not find decl for element %s\n",
		   cur->name, cur->elem, NULL);
	    return;
	}
	if (elem->etype == XML_ELEMENT_TYPE_EMPTY) {
	    xmlErrValidNode(ctxt, NULL, XML_DTD_EMPTY_NOTATION,
		   "NOTATION attribute %s declared for EMPTY element %s\n",
		   cur->name, cur->elem, NULL);
	    ctxt->valid = 0;
	}
    }
}